

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arm.cpp
# Opt level: O3

void __thiscall arm::Function::display(Function *this,ostream *o)

{
  element_type *peVar1;
  pointer puVar2;
  char cVar3;
  ostream *poVar4;
  _Rb_tree_node_base *p_Var5;
  undefined **ppuVar6;
  Inst *pIVar7;
  unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *i;
  pointer puVar8;
  
  cVar3 = (char)o;
  for (p_Var5 = (this->local_const)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var5 != &(this->local_const)._M_t._M_impl.super__Rb_tree_header;
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (o,*(char **)(p_Var5 + 1),(long)p_Var5[1]._M_parent);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,":",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(o,"\t",1);
    (*(code *)**(undefined8 **)(p_Var5 + 2))(p_Var5 + 2,o);
    std::ios::widen((char)*(undefined8 *)(*(long *)o + -0x18) + cVar3);
    std::ostream::put(cVar3);
    std::ostream::flush();
  }
  std::__ostream_insert<char,std::char_traits<char>>(o,"\t.globl ",8);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (o,(this->name)._M_dataplus._M_p,(this->name)._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(o,"\t@ ",3);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (o,(this->name)._M_dataplus._M_p,(this->name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,": ",2);
  peVar1 = (this->ty).super___shared_ptr<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (**(peVar1->super_Ty).super_Displayable._vptr_Displayable)(peVar1,poVar4);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (o,(this->name)._M_dataplus._M_p,(this->name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,":",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(o,"\t.fnstart",9);
  std::ios::widen((char)*(undefined8 *)(*(long *)o + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  puVar2 = (this->inst).
           super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar8 = (this->inst).
                super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar8 != puVar2; puVar8 = puVar8 + 1) {
    pIVar7 = (puVar8->_M_t).super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>._M_t.
             super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
             super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl;
    if (pIVar7 == (Inst *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>(o,"!!!nullptr!!!",0xd);
    }
    else {
      ppuVar6 = &PTR_display_001ed738;
      if ((pIVar7->super_Displayable)._vptr_Displayable != (_func_int **)&PTR_display_001ed738) {
        std::__ostream_insert<char,std::char_traits<char>>(o,"\t",1);
        pIVar7 = (puVar8->_M_t).super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>.
                 _M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                 super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl;
        ppuVar6 = (pIVar7->super_Displayable)._vptr_Displayable;
      }
      (*(code *)*ppuVar6)(pIVar7,o);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)o + -0x18) + cVar3);
    std::ostream::put(cVar3);
    std::ostream::flush();
  }
  std::__ostream_insert<char,std::char_traits<char>>(o,"\t.fnend",7);
  std::ios::widen((char)*(undefined8 *)(*(long *)o + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  return;
}

Assistant:

void Function::display(std::ostream &o) const {
  for (auto &v : this->local_const) {
    o << v.first << ":" << std::endl;
    o << "\t" << v.second << std::endl;
  }

  o << "\t.globl " << name << std::endl;

  o << "\t@ " << name << ": " << *ty << std::endl;

  o << name << ":" << std::endl;
  // o << "\t.align 7" << std::endl;
  o << "\t.fnstart" << std::endl;
  for (auto &i : inst) {
    if (i == nullptr) {
      o << "!!!nullptr!!!" << std::endl;
      continue;
    } else if (dynamic_cast<LabelInst *>(&*i) == nullptr) {
      o << "\t";
    }
    o << *i << std::endl;
  }
  o << "\t.fnend" << std::endl;
}